

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane.h
# Opt level: O0

void __thiscall Plane::prepare_coords(Plane *this)

{
  float *pfVar1;
  Matrix3f *in_RDI;
  double dVar2;
  Vector3f v2;
  Vector3f v1;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  Vector3f *in_stack_ffffffffffffff98;
  Matrix3f *in_stack_ffffffffffffffa0;
  Vector3f *in_stack_ffffffffffffffb0;
  Vector3f *in_stack_ffffffffffffffb8;
  Vector3f *in_stack_ffffffffffffffc0;
  Vector3f local_20;
  float in_stack_ffffffffffffffec;
  bool *in_stack_fffffffffffffff0;
  Matrix3f *this_00;
  
  this_00 = in_RDI;
  Vector3f::Vector3f((Vector3f *)&stack0xffffffffffffffec,0.0);
  Vector3f::Vector3f(&local_20,0.0);
  Vector3f::operator=((Vector3f *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (Vector3f *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI->m_elements + 6),0);
  dVar2 = std::fabs((double)(ulong)(uint)*pfVar1);
  if (SUB84(dVar2,0) <= 0.0001) {
    pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI->m_elements + 6),1);
    dVar2 = std::fabs((double)(ulong)(uint)*pfVar1);
    if (SUB84(dVar2,0) <= 0.0001) {
      in_stack_ffffffffffffff78 = in_RDI[1].m_elements[0];
      pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI->m_elements + 6),2);
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff78 / *pfVar1;
      pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI[1].m_elements + 1),2);
      *pfVar1 = in_stack_ffffffffffffff7c;
    }
    else {
      in_stack_ffffffffffffff80 = in_RDI[1].m_elements[0];
      pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI->m_elements + 6),1);
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff80 / *pfVar1;
      pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI[1].m_elements + 1),1);
      *pfVar1 = in_stack_ffffffffffffff84;
    }
  }
  else {
    in_stack_ffffffffffffff88 = in_RDI[1].m_elements[0];
    pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI->m_elements + 6),0);
    in_stack_ffffffffffffff8c = in_stack_ffffffffffffff88 / *pfVar1;
    pfVar1 = Vector3f::operator[]((Vector3f *)(in_RDI[1].m_elements + 1),0);
    *pfVar1 = in_stack_ffffffffffffff8c;
  }
  createCoordinateSystem
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  Matrix3f::Matrix3f(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(Vector3f *)in_RDI,
                     (Vector3f *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     SUB41((uint)in_stack_ffffffffffffff84 >> 0x18,0));
  Matrix3f::inverse(this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  Matrix3f::operator=((Matrix3f *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (Matrix3f *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  return;
}

Assistant:

void prepare_coords() {
		Vector3f v1, v2;
		o = Vector3f::ZERO;
		if (fabs(norm[0]) > 1e-4) o[0] = d / norm[0];
		else if (fabs(norm[1]) > 1e-4) o[1] = d / norm[1];
		else o[2] = d / norm[2];
		createCoordinateSystem(norm, v1, v2);
		//norm,v1,v2 factorization
		matrix = Matrix3f(norm, v1, v2).inverse();
	}